

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O1

int rng_rand(RNG_state *mystate)

{
  return (mystate[0x10] & 0x7f) << 0x18 | (uint)mystate[0x11] << 0x10 | (uint)mystate[0x12] << 8 |
         (uint)mystate[0x13];
}

Assistant:

int rng_rand(RNG_state *mystate){
        int r;
	uint_32t b =  (mystate[16] << 24) | (mystate[17] << 16)
		| (mystate[18] << 8) | (mystate[19] << 0);
	b = b & POS_MASK;
	
	r = (int) b;
	//printf("b: %d\t, r: %d\n", b, r);
	return r;
}